

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_instance.c
# Opt level: O3

apx_portInstance_t * apx_nodeInstance_find_port_by_name(apx_nodeInstance_t *self,char *name)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  ulong uVar4;
  apx_portInstance_t *paVar5;
  
  if (name != (char *)0x0 && self != (apx_nodeInstance_t *)0x0) {
    if (self->num_provide_ports != 0) {
      lVar3 = 0;
      uVar4 = 0;
      do {
        paVar5 = (apx_portInstance_t *)((long)&self->provide_ports->pack_program + lVar3);
        pcVar2 = apx_portInstance_name(paVar5);
        if ((pcVar2 != (char *)0x0) && (iVar1 = strcmp(pcVar2,name), iVar1 == 0)) {
          return paVar5;
        }
        uVar4 = uVar4 + 1;
        lVar3 = lVar3 + 0x58;
      } while (uVar4 < self->num_provide_ports);
    }
    if (self->num_require_ports != 0) {
      lVar3 = 0;
      uVar4 = 0;
      do {
        paVar5 = (apx_portInstance_t *)((long)&self->require_ports->pack_program + lVar3);
        pcVar2 = apx_portInstance_name(paVar5);
        if ((pcVar2 != (char *)0x0) && (iVar1 = strcmp(pcVar2,name), iVar1 == 0)) {
          return paVar5;
        }
        uVar4 = uVar4 + 1;
        lVar3 = lVar3 + 0x58;
      } while (uVar4 < self->num_require_ports);
    }
  }
  return (apx_portInstance_t *)0x0;
}

Assistant:

apx_portInstance_t* apx_nodeInstance_find_port_by_name(apx_nodeInstance_t const* self, char const* name)
{
   if ((self != NULL) && (name != NULL))
   {
      apx_size_t port_id;
      if (self->num_provide_ports > 0)
      {
         for (port_id = 0u; port_id < self->num_provide_ports; port_id++)
         {
            apx_portInstance_t* port_instance = &self->provide_ports[port_id];
            char const* port_name = apx_portInstance_name(port_instance);
            if ((port_name != NULL) && (strcmp(port_name, name) == 0))
            {
               return port_instance;
            }
         }
      }
      if (self->num_require_ports > 0)
      {
         for (port_id = 0u; port_id < self->num_require_ports; port_id++)
         {
            apx_portInstance_t* port_instance = &self->require_ports[port_id];
            char const* port_name = apx_portInstance_name(port_instance);
            if ((port_name != NULL) && (strcmp(port_name, name) == 0))
            {
               return port_instance;
            }
         }
      }
   }
   return NULL;
}